

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  archive_rb_tree *rbt;
  size_t min;
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined4 uVar6;
  zip *pzVar7;
  uLong uVar8;
  char *pcVar9;
  int iVar10;
  wchar_t wVar11;
  uint uVar12;
  zip_entry *pzVar13;
  archive_rb_node *paVar14;
  void *pvVar15;
  time_t tVar16;
  ulong n;
  int64_t iVar17;
  Bytef *p;
  long lVar18;
  int *piVar19;
  Bytef *__src;
  char *__s;
  long request;
  char *pcVar20;
  archive_rb_node *paVar21;
  int64_t request_00;
  archive_rb_tree *paVar22;
  char *pcVar23;
  archive_string *as;
  archive_rb_node *paVar24;
  Bytef *local_78;
  archive_string local_68;
  archive_entry *local_50;
  archive_rb_node *local_48;
  archive_rb_tree *local_40;
  long local_38;
  
  pzVar7 = (zip *)a->format->data;
  if (pzVar7->has_encrypted_entries == -1) {
    pzVar7->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar7->zip_entries == (zip_entry *)0x0) {
    local_50 = entry;
    iVar17 = __archive_read_seek(a,pzVar7->central_directory_offset,0);
    if ((-1 < iVar17) && (pvVar15 = __archive_read_ahead(a,0x14,&local_38), pvVar15 != (void *)0x0))
    {
      do {
        if (4 < local_38) {
          iVar17 = 0;
LAB_0017f48c:
          cVar1 = *(char *)((long)pvVar15 + iVar17 + 3);
          switch(cVar1) {
          case '\x01':
          case '\x05':
            goto switchD_0017f4a0_caseD_1;
          case '\x02':
            if (*(int *)((long)pvVar15 + iVar17) != 0x2014b50) goto switchD_0017f4a0_caseD_3;
LAB_0017f50d:
            __archive_read_consume(a,iVar17);
            iVar17 = archive_filter_bytes(&a->archive,0);
            local_48 = (archive_rb_node *)(iVar17 - pzVar7->central_directory_offset);
            rbt = &pzVar7->tree;
            __archive_rb_tree_init(rbt,&rb_ops);
            local_40 = &pzVar7->tree_rsrc;
            __archive_rb_tree_init(local_40,&rb_rsrc_ops);
            pzVar7->central_directory_entries_total = 0;
            piVar19 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
            goto joined_r0x0017f56c;
          case '\x03':
          case '\x04':
switchD_0017f4a0_caseD_3:
            iVar17 = iVar17 + 4;
            goto LAB_0017f4de;
          case '\x06':
            if ((*(int *)((long)pvVar15 + iVar17) == 0x6054b50) ||
               (*(int *)((long)pvVar15 + iVar17) == 0x6064b50)) goto LAB_0017f50d;
            goto switchD_0017f4a0_caseD_1;
          default:
            if (cVar1 == 'P') {
              iVar17 = iVar17 + 3;
            }
            else {
              if (cVar1 != 'K') goto switchD_0017f4a0_caseD_3;
              iVar17 = iVar17 + 2;
            }
            goto LAB_0017f4de;
          }
        }
        iVar17 = 0;
LAB_0017f4e7:
        __archive_read_consume(a,iVar17);
        pvVar15 = __archive_read_ahead(a,0x14,&local_38);
      } while (pvVar15 != (void *)0x0);
    }
    return L'\xffffffe2';
  }
  if (pzVar7->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pzVar13 = (zip_entry *)__archive_rb_tree_iterate(&pzVar7->tree,&pzVar7->entry->node,1);
  pzVar7->entry = pzVar13;
LAB_0017f40b:
  if (pzVar13 == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar20 = (pzVar13->rsrcname).s;
  if (pcVar20 == (char *)0x0) {
    paVar14 = (archive_rb_node *)0x0;
  }
  else {
    paVar14 = __archive_rb_tree_find_node(&pzVar7->tree_rsrc,pcVar20);
  }
  iVar17 = archive_filter_bytes(&a->archive,0);
  lVar18 = pzVar7->entry->local_header_offset;
  request = lVar18 - iVar17;
  if (request == 0 || lVar18 < iVar17) {
    if (request != 0) {
      __archive_read_seek(a,lVar18,0);
    }
  }
  else {
    __archive_read_consume(a,request);
  }
  pzVar7->unconsumed = 0;
  wVar11 = zip_read_local_file_header(a,entry,pzVar7);
  if (wVar11 != L'\0') {
    return wVar11;
  }
  if (paVar14 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar7 = (zip *)a->format->data;
  iVar17 = archive_filter_bytes(&a->archive,0);
  if ((*(byte *)(paVar14[5].rb_nodes + 1) & 0xf7) != 0) {
    lVar18 = 8;
    paVar24 = (archive_rb_node *)0x1f1edf;
    do {
      if (*(uint *)((long)&PTR_bid_keyword_keys_u_0021d3a8 + lVar18) ==
          (uint)*(byte *)(paVar14[5].rb_nodes + 1)) {
        paVar24 = *(archive_rb_node **)((long)&compression_methods[0].id + lVar18);
        break;
      }
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x168);
    pcVar20 = "Unsupported ZIP compression method (%s)";
LAB_0017f9ef:
    archive_set_error(&a->archive,0x54,pcVar20,paVar24);
    return L'\xffffffec';
  }
  paVar24 = paVar14[2].rb_nodes[0];
  if (0x400000 < (long)paVar24) {
    pcVar20 = "Mac metadata is too large: %jd > 4M bytes";
    goto LAB_0017f9ef;
  }
  p = (Bytef *)malloc((size_t)paVar24);
  if (p == (Bytef *)0x0) {
    pcVar20 = "Can\'t allocate memory for Mac metadata";
    iVar10 = 0xc;
LAB_0017fa14:
    archive_set_error(&a->archive,iVar10,pcVar20);
    return L'\xffffffe2';
  }
  paVar24 = paVar14[1].rb_nodes[1];
  lVar18 = (long)paVar24 - iVar17;
  if (lVar18 == 0 || (long)paVar24 < iVar17) {
    if (lVar18 != 0) {
      __archive_read_seek(a,(int64_t)paVar24,0);
    }
  }
  else {
    __archive_read_consume(a,lVar18);
  }
  piVar19 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar19 == (int *)0x0) {
    pcVar20 = "Truncated ZIP file header";
    iVar10 = 0x54;
  }
  else {
    if (*piVar19 == 0x4034b50) {
      request_00 = (ulong)*(ushort *)((long)piVar19 + 0x1a) + (ulong)*(ushort *)(piVar19 + 7) + 0x1e
      ;
      goto LAB_0017fa9c;
    }
    pcVar20 = "Damaged Zip archive";
    iVar10 = -1;
  }
  archive_set_error(&a->archive,iVar10,pcVar20);
  request_00 = -0x14;
LAB_0017fa9c:
  __archive_read_consume(a,request_00);
  pcVar20 = (char *)paVar14[1].rb_info;
  paVar24 = paVar14[2].rb_nodes[0];
  paVar21 = paVar24;
  if (pcVar20 != (char *)0x0) {
    local_78 = p;
    local_50 = entry;
    local_48 = paVar14;
    do {
      __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_68);
      if (__src == (Bytef *)0x0) {
        archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
        wVar11 = L'\xffffffec';
        goto LAB_0017fc76;
      }
      if (pcVar20 < local_68.s) {
        local_68.s = pcVar20;
      }
      if (*(char *)(paVar14[5].rb_nodes + 1) == '\b') {
        wVar11 = zip_deflate_init(a,pzVar7);
        if (wVar11 != L'\0') goto LAB_0017fc76;
        (pzVar7->stream).next_in = __src;
        (pzVar7->stream).avail_in = (uInt)local_68.s;
        (pzVar7->stream).total_in = 0;
        (pzVar7->stream).next_out = local_78;
        (pzVar7->stream).avail_out = (uInt)paVar24;
        (pzVar7->stream).total_out = 0;
        uVar12 = cm_zlib_inflate(&pzVar7->stream,0);
        if (1 < uVar12) {
          if (uVar12 == 0xfffffffc) {
            archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
          }
          else {
            archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar12);
          }
          wVar11 = L'\xffffffe2';
          goto LAB_0017fc76;
        }
        pcVar23 = (char *)(pzVar7->stream).total_in;
        uVar8 = (pzVar7->stream).total_out;
        paVar24 = (archive_rb_node *)((long)paVar24 - uVar8);
        local_78 = local_78 + uVar8;
        paVar14 = local_48;
      }
      else if (*(char *)(paVar14[5].rb_nodes + 1) == '\0') {
        memcpy(local_78,__src,(size_t)local_68.s);
        local_78 = local_78 + (long)local_68.s;
        paVar24 = (archive_rb_node *)((long)paVar24 - (long)local_68.s);
        uVar12 = (uint)(paVar24 == (archive_rb_node *)0x0);
        pcVar23 = local_68.s;
      }
      else {
        uVar12 = 0;
        pcVar23 = (char *)0x0;
      }
      __archive_read_consume(a,(int64_t)pcVar23);
    } while ((uVar12 == 0) && (pcVar20 = pcVar20 + -(long)pcVar23, pcVar20 != (char *)0x0));
    paVar21 = paVar14[2].rb_nodes[0];
    entry = local_50;
  }
  archive_entry_copy_mac_metadata(entry,p,(long)paVar21 - (long)paVar24);
  wVar11 = L'\0';
LAB_0017fc76:
  __archive_read_seek(a,iVar17,0);
  pzVar7->decompress_init = '\0';
  free(p);
  return wVar11 >> 0x1f & wVar11;
joined_r0x0017f56c:
  if (piVar19 == (int *)0x0) {
    return L'\xffffffe2';
  }
  if ((*piVar19 == 0x6064b50) || (*piVar19 == 0x6054b50)) {
    pzVar13 = (zip_entry *)__archive_rb_tree_iterate(rbt,(archive_rb_node *)0x0,0);
    pzVar7->entry = pzVar13;
    entry = local_50;
    goto LAB_0017f40b;
  }
  if (*piVar19 != 0x2014b50) {
    pcVar20 = "Invalid central directory signature";
    iVar10 = -1;
    goto LAB_0017fa14;
  }
  pvVar15 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
  if (pvVar15 == (void *)0x0) {
    return L'\xffffffe2';
  }
  pzVar13 = (zip_entry *)calloc(1,0x88);
  pzVar13->next = pzVar7->zip_entries;
  pzVar13->flags = '\x02';
  pzVar7->zip_entries = pzVar13;
  pzVar7->central_directory_entries_total = pzVar7->central_directory_entries_total + 1;
  pzVar13->system = *(uchar *)((long)pvVar15 + 5);
  bVar2 = *(byte *)((long)pvVar15 + 8);
  pzVar13->zip_flags = *(uint16_t *)((long)pvVar15 + 8);
  if ((bVar2 & 0x41) != 0) {
    pzVar7->has_encrypted_entries = 1;
  }
  pzVar13->compression = *(uchar *)((long)pvVar15 + 10);
  tVar16 = zip_time((char *)((long)pvVar15 + 0xc));
  pzVar13->mtime = tVar16;
  pzVar13->cm_zlib_crc32 = *(uint32_t *)((long)pvVar15 + 0x10);
  pzVar13->compressed_size = (ulong)*(uint *)((long)pvVar15 + 0x14);
  pzVar13->uncompressed_size = (ulong)*(uint *)((long)pvVar15 + 0x18);
  uVar3 = *(ushort *)((long)pvVar15 + 0x1c);
  n = (ulong)uVar3;
  uVar4 = *(ushort *)((long)pvVar15 + 0x1e);
  uVar5 = *(ushort *)((long)pvVar15 + 0x20);
  uVar6 = *(undefined4 *)((long)pvVar15 + 0x26);
  pzVar13->local_header_offset = (long)local_48->rb_nodes + (ulong)*(uint *)((long)pvVar15 + 0x2a);
  pzVar13->mode = 0;
  if (pzVar13->system == '\x03') {
    pzVar13->mode = (uint16_t)((uint)uVar6 >> 0x10);
  }
  __archive_read_consume(a,0x2e);
  min = n + uVar4;
  pcVar20 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
  if (pcVar20 == (char *)0x0) {
    pcVar20 = "Truncated ZIP file header";
    iVar10 = 0x54;
    goto LAB_0017fa14;
  }
  pcVar23 = pcVar20 + n;
  process_extra(pcVar23,(ulong)uVar4,pzVar13);
  pcVar9 = pcVar20;
  if (pzVar7->process_mac_extensions == 0) {
    __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar13);
  }
  else {
    do {
      __s = pcVar9;
      pvVar15 = memchr(__s,0x2f,(long)pcVar23 - (long)__s);
      pcVar9 = (char *)((long)pvVar15 + 1);
    } while (pvVar15 != (void *)0x0);
    if ((uVar3 < 9) || (iVar10 = strncmp("__MACOSX/",pcVar20,9), iVar10 != 0)) {
      as = &pzVar13->rsrcname;
      (pzVar13->rsrcname).length = 0;
      archive_strncat(as,"__MACOSX/",9);
      archive_strncat(as,pcVar20,(long)__s - (long)pcVar20);
      archive_strcat(as,"._");
      archive_strncat(as,__s,n - ((long)__s - (long)pcVar20));
      paVar22 = rbt;
    }
    else {
      if ((pcVar23[-1] != '/') &&
         ((((long)__s - (long)pcVar20 < 3 || (*__s != '.')) || (__s[1] != '_')))) {
        __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar13);
        local_68.s = (char *)0x0;
        local_68.length = 0;
        local_68.buffer_length = 0;
        archive_strncat(&local_68,pcVar20,n);
        pcVar20 = strrchr(local_68.s,0x2f);
        paVar22 = local_40;
        while (pcVar20 != (char *)0x0) {
          *pcVar20 = '\0';
          paVar14 = __archive_rb_tree_find_node(paVar22,local_68.s);
          if (paVar14 == (archive_rb_node *)0x0) break;
          __archive_rb_tree_remove_node(paVar22,paVar14);
          archive_string_free((archive_string *)(paVar14 + 3));
          __archive_rb_tree_insert_node(rbt,paVar14);
          pcVar20 = strrchr(local_68.s,0x2f);
        }
        archive_string_free(&local_68);
        goto LAB_0017f79e;
      }
      (pzVar13->rsrcname).length = 0;
      archive_strncat(&pzVar13->rsrcname,pcVar20,n);
      paVar22 = local_40;
    }
    __archive_rb_tree_insert_node(paVar22,(archive_rb_node *)pzVar13);
  }
LAB_0017f79e:
  __archive_read_consume(a,min + uVar5);
  piVar19 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
  goto joined_r0x0017f56c;
switchD_0017f4a0_caseD_1:
  iVar17 = iVar17 + 1;
LAB_0017f4de:
  if (local_38 + -4 <= iVar17) goto LAB_0017f4e7;
  goto LAB_0017f48c;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid redundant
	 * data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset, SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}